

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cloud.c
# Opt level: O3

void cloudSupport(CloudManager *dd,CloudNode *n,int *support)

{
  uint uVar1;
  int *piVar2;
  byte bVar3;
  int *support_00;
  
  uVar1 = dd->bitsNode;
  bVar3 = (byte)(uVar1 >> 0x1c) & 1 | (uVar1 & 0xefffffff) == 0xfffffff;
  support_00 = (int *)(ulong)bVar3;
  if (bVar3 == 0) {
    piVar2 = &dd->bitsNode;
    do {
      *piVar2 = uVar1 | 0x10000000;
      (&n->s)[uVar1 | 0x10000000] = 1;
      cloudSupport(*(CloudManager **)(dd->bitsCache + 2),n,support_00);
      dd = (CloudManager *)(*(ulong *)dd->bitsCache & 0xfffffffffffffffe);
      uVar1 = dd->bitsNode;
      if ((uVar1 & 0xefffffff) == 0xfffffff) {
        return;
      }
      piVar2 = &dd->bitsNode;
      support_00 = (int *)(ulong)(uVar1 & 0x10000000);
    } while ((uVar1 & 0x10000000) == 0);
  }
  return;
}

Assistant:

static void cloudSupport( CloudManager * dd, CloudNode * n, int * support )
{
    if ( cloudIsConstant(n) || cloudNodeIsMarked(n) )
        return;
    // set visited flag
    cloudNodeMark(n);
    support[cloudV(n)] = 1;
    cloudSupport( dd, cloudT(n), support );
    cloudSupport( dd, Cloud_Regular(cloudE(n)), support );
}